

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool EncrStream_BlockRead
               (TEncryptedStream *pStream,ULONGLONG StartOffset,ULONGLONG EndOffset,
               LPBYTE BlockBuffer,DWORD BytesNeeded,bool bAvailable)

{
  bool bVar1;
  DWORD DVar2;
  DWORD dwBytesToRead;
  bool bAvailable_local;
  DWORD BytesNeeded_local;
  LPBYTE BlockBuffer_local;
  ULONGLONG EndOffset_local;
  ULONGLONG StartOffset_local;
  TEncryptedStream *pStream_local;
  
  EndOffset_local = StartOffset;
  StartOffset_local = (ULONGLONG)pStream;
  if ((StartOffset & (pStream->super_TBlockStream).BlockSize - 1) != 0) {
    __assert_fail("(StartOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x81a,
                  "bool EncrStream_BlockRead(TEncryptedStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (EndOffset <= StartOffset) {
    __assert_fail("StartOffset < EndOffset",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x81b,
                  "bool EncrStream_BlockRead(TEncryptedStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (!bAvailable) {
    __assert_fail("bAvailable != false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x81c,
                  "bool EncrStream_BlockRead(TEncryptedStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  DVar2 = (int)EndOffset - (int)StartOffset;
  bVar1 = (*(pStream->super_TBlockStream).super_TFileStream.BaseRead)
                    ((TFileStream *)pStream,&EndOffset_local,BlockBuffer,DVar2);
  if (bVar1) {
    DecryptFileChunk((DWORD *)BlockBuffer,(LPBYTE)(StartOffset_local + 0xfc),EndOffset_local,
                     DVar2 + 0x3f & 0xffffffc0);
  }
  return bVar1;
}

Assistant:

static bool EncrStream_BlockRead(
    TEncryptedStream * pStream,
    ULONGLONG StartOffset,
    ULONGLONG EndOffset,
    LPBYTE BlockBuffer,
    DWORD BytesNeeded,
    bool bAvailable)
{
    DWORD dwBytesToRead;

    assert((StartOffset & (pStream->BlockSize - 1)) == 0);
    assert(StartOffset < EndOffset);
    assert(bAvailable != false);
    BytesNeeded = BytesNeeded;
    bAvailable = bAvailable;

    // Read the file from the stream as-is
    // Limit the reading to number of blocks really needed
    dwBytesToRead = (DWORD)(EndOffset - StartOffset);
    if(!pStream->BaseRead(pStream, &StartOffset, BlockBuffer, dwBytesToRead))
        return false;

    // Decrypt the data
    dwBytesToRead = (dwBytesToRead + ENCRYPTED_CHUNK_SIZE - 1) & ~(ENCRYPTED_CHUNK_SIZE - 1);
    DecryptFileChunk((PDWORD)BlockBuffer, pStream->Key, StartOffset, dwBytesToRead);
    return true;
}